

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestSpecParser::processOtherChar(TestSpecParser *this,char c)

{
  bool bVar1;
  
  bVar1 = isControlChar(this,c);
  if (bVar1) {
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    push_back(&this->m_substring,c);
    endMode(this);
  }
  return bVar1;
}

Assistant:

bool TestSpecParser::processOtherChar( char c ) {
        if( !isControlChar( c ) )
            return false;
        m_substring += c;
        endMode();
        return true;
    }